

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O0

void test_end(fitsfile *infits,FILE *out)

{
  int hdutype;
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  int status;
  int in_stack_000000c4;
  int *in_stack_000000c8;
  char *in_stack_000000d0;
  FILE *in_stack_000000d8;
  int in_stack_00000624;
  int *in_stack_00000628;
  char *in_stack_00000630;
  FILE *in_stack_00000638;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  FILE *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  ffmrhd((fitsfile *)(ulong)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
         (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
         &in_stack_ffffffffffffffd0->_flags);
  if (iVar1 == 0) {
    wrtout(in_stack_ffffffffffffffd0,
           (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    sprintf(errmes,"There are extraneous HDU(s) beyond the end of last HDU.");
    wrterr((FILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
           (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    wrtout(in_stack_ffffffffffffffd0,
           (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else if (iVar1 == 0x6b) {
    iVar2 = 0;
    ffcmsg();
    iVar1 = ffghadll((fitsfile *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                     (LONGLONG *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (LONGLONG *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (LONGLONG *)in_stack_ffffffffffffffd0,
                     (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (iVar1 != 0) {
      wrtferr(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
    }
    iVar1 = ffmbyt((fitsfile *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc,&in_stack_ffffffffffffffd0->_flags);
    if (iVar1 == 0) {
      ffmbyt((fitsfile *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
             ,&in_stack_ffffffffffffffd0->_flags);
      if (iVar2 == 0) {
        wrtout(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        sprintf(errmes,"File has extra byte(s) after last HDU at byte %ld.",
                in_stack_ffffffffffffffd0);
        wrterr((FILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        wrtout(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
    }
    else {
      sprintf(errmes,"Error trying to read last byte of the file at byte %ld.",
              in_stack_ffffffffffffffd0);
      wrterr((FILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      wrtout(in_stack_ffffffffffffffd0,
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      wrtout(in_stack_ffffffffffffffd0,
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  else {
    wrtserr(in_stack_00000638,in_stack_00000630,in_stack_00000628,in_stack_00000624);
  }
  return;
}

Assistant:

void  test_end(fitsfile *infits, 
		  FILE *out) 

{   
   int status = 0; 
   LONGLONG headstart, datastart, dataend;
   int hdutype;

   /* check whether there are any HDU left */ 
   fits_movrel_hdu(infits,1, &hdutype, &status);
   if (!status) {
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
    "There are extraneous HDU(s) beyond the end of last HDU.");
       wrterr(out,errmes,2);
       wrtout(out," ");
       return;
   }

   if (status != END_OF_FILE) { 
      wrtserr(out,"Bad HDU? ",&status,2);
      return;
   } 

   status = 0;  
   fits_clear_errmsg();
   if(ffghadll(infits, &headstart, &datastart, &dataend, &status)) 
       wrtferr(out, "",&status,1);

   /* try to move to the last byte of this extension.  */
   if (ffmbyt(infits, dataend - 1,0,&status))
   {
       sprintf(errmes, 
   "Error trying to read last byte of the file at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out,"< End-of-File >");
       wrtout(out," ");
       return;
   } 

   /* try to move to what would be the first byte of the next extension. 
     If successfull, we have a problem... */

   ffmbyt(infits, dataend,0,&status);
   if(status == 0) { 
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
     "File has extra byte(s) after last HDU at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out," ");
   } 

   return;
}